

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  uint uVar1;
  secp256k1_gej pj;
  secp256k1_gej sStack_a8;
  
  uVar1 = secp256k1_scalar_set_b32_seckey(seckey_scalar,seckey);
  secp256k1_scalar_cmov(seckey_scalar,&secp256k1_scalar_one,uVar1 ^ 1);
  secp256k1_ecmult_gen(ecmult_gen_ctx,&sStack_a8,seckey_scalar);
  secp256k1_ge_set_gej(p,&sStack_a8);
  return uVar1;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    return ret;
}